

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ParseContext::ParseGroup
          (ParseContext *this,MessageLite *msg,char *ptr,uint32_t tag)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  LogMessage *pLVar4;
  undefined1 auVar5 [16];
  LogMessageFatal local_88 [23];
  Voidify local_71;
  string *local_70;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_60;
  LogMessageFatal local_58 [23];
  Voidify local_41;
  string *local_40;
  string *absl_log_internal_check_op_result;
  int local_30;
  int old_group_depth;
  int old_depth;
  uint32_t tag_local;
  char *ptr_local;
  MessageLite *msg_local;
  ParseContext *this_local;
  
  iVar2 = this->depth_ + -1;
  this->depth_ = iVar2;
  if (iVar2 < 0) {
    this_local = (ParseContext *)0x0;
  }
  else {
    this->group_depth_ = this->group_depth_ + 1;
    local_30 = this->depth_;
    absl_log_internal_check_op_result._4_4_ = this->group_depth_;
    old_group_depth = tag;
    _old_depth = (ParseContext *)ptr;
    ptr_local = (char *)msg;
    msg_local = (MessageLite *)this;
    _old_depth = (ParseContext *)MessageLite::_InternalParse(msg,ptr,this);
    if (_old_depth != (ParseContext *)0x0) {
      iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue(local_30);
      iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(this->depth_);
      local_40 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                           (iVar2,iVar3,"old_depth == depth_");
      if (local_40 != (string *)0x0) {
        auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
        local_60 = auVar5._8_8_;
        absl_log_internal_check_op_result_1 = auVar5._0_8_;
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_58,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,0x217,absl_log_internal_check_op_result_1,local_60);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_58);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_41,pLVar4);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_58);
      }
      iVar2 = absl::lts_20240722::log_internal::GetReferenceableValue
                        (absl_log_internal_check_op_result._4_4_);
      iVar3 = absl::lts_20240722::log_internal::GetReferenceableValue(this->group_depth_);
      local_70 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                           (iVar2,iVar3,"old_group_depth == group_depth_");
      if (local_70 != (string *)0x0) {
        auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_70);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_88,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,0x218,auVar5._0_8_,auVar5._8_8_);
        pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                           ((LogMessage *)local_88);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_71,pLVar4);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_88);
      }
      local_70 = (string *)0x0;
    }
    this->group_depth_ = this->group_depth_ + -1;
    this->depth_ = this->depth_ + 1;
    bVar1 = EpsCopyInputStream::ConsumeEndGroup(&this->super_EpsCopyInputStream,old_group_depth);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_local = _old_depth;
    }
    else {
      this_local = (ParseContext *)0x0;
    }
  }
  return (char *)this_local;
}

Assistant:

PROTOBUF_NODISCARD PROTOBUF_NDEBUG_INLINE const char* ParseGroup(
      MessageLite* msg, const char* ptr, uint32_t tag) {
    if (--depth_ < 0) return nullptr;
    group_depth_++;
    auto old_depth = depth_;
    auto old_group_depth = group_depth_;
    ptr = msg->_InternalParse(ptr, this);
    if (ptr != nullptr) {
      ABSL_DCHECK_EQ(old_depth, depth_);
      ABSL_DCHECK_EQ(old_group_depth, group_depth_);
    }
    group_depth_--;
    depth_++;
    if (PROTOBUF_PREDICT_FALSE(!ConsumeEndGroup(tag))) return nullptr;
    return ptr;
  }